

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this,ActionMessage *act)

{
  pointer pbVar1;
  int32_t iVar2;
  uint16_t uVar3;
  
  iVar2 = act->messageID;
  this->messageAction = act->messageAction;
  this->messageID = iVar2;
  (this->source_id).gid = (act->source_id).gid;
  (this->source_handle).hid = (act->source_handle).hid;
  (this->dest_id).gid = (act->dest_id).gid;
  (this->dest_handle).hid = (act->dest_handle).hid;
  uVar3 = act->flags;
  this->counter = act->counter;
  this->flags = uVar3;
  this->sequenceID = act->sequenceID;
  (this->actionTime).internalTimeCode = (act->actionTime).internalTimeCode;
  (this->Te).internalTimeCode = (act->Te).internalTimeCode;
  (this->Tdemin).internalTimeCode = (act->Tdemin).internalTimeCode;
  (this->Tso).internalTimeCode = (act->Tso).internalTimeCode;
  SmallBuffer::SmallBuffer(&this->payload,&act->payload);
  pbVar1 = (act->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (act->stringData).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (act->stringData).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (act->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (act->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (act->stringData).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ActionMessage::ActionMessage(ActionMessage&& act) noexcept:
    messageAction(act.messageAction), messageID(act.messageID), source_id(act.source_id),
    source_handle(act.source_handle), dest_id(act.dest_id), dest_handle(act.dest_handle),
    counter(act.counter), flags(act.flags), sequenceID(act.sequenceID), actionTime(act.actionTime),
    Te(act.Te), Tdemin(act.Tdemin), Tso(act.Tso), payload(std::move(act.payload)),
    stringData(std::move(act.stringData))
{
}